

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cpp
# Opt level: O0

void crc32_init(void)

{
  uint local_1c;
  int local_18;
  int local_14;
  int k;
  int t;
  uint32_t res;
  int i;
  
  if (!_tableInitialized) {
    for (t = 0; t < 0x100; t = t + 1) {
      k = t;
      for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
        for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
          if ((k & 1U) == 1) {
            local_1c = (uint)k >> 1 ^ 0x82f63b78;
          }
          else {
            local_1c = (uint)k >> 1;
          }
          k = local_1c;
        }
        table[local_14][t] = k;
      }
    }
    _tableInitialized = true;
  }
  return;
}

Assistant:

void crc32_init()
{
	if (_tableInitialized) return;

	for(int i = 0; i < 256; i++) 
	{
		uint32_t res = (uint32_t)i;
		for(int t = 0; t < 16; t++) {
			for (int k = 0; k < 8; k++) res = (res & 1) == 1 ? POLY ^ (res >> 1) : (res >> 1);
			table[t][i] = res;
		}
	}

	_tableInitialized = true;
}